

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O1

void d_arithmetic_setup(void)

{
  t_symbol *ptVar1;
  _class *p_Var2;
  
  ptVar1 = gensym("+~");
  p_Var2 = class_new(ptVar1,plus_new,(t_method)0x0,0x38,0,A_GIMME,0);
  plus_class = p_Var2;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,plus_dsp,ptVar1,A_CANT);
  class_domainsignalin(plus_class,0x30);
  p_Var2 = plus_class;
  ptVar1 = gensym("binops-tilde");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("+~");
  scalarplus_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x38,0,A_NULL);
  class_domainsignalin(scalarplus_class,0x30);
  p_Var2 = scalarplus_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,scalarplus_dsp,ptVar1,A_CANT);
  p_Var2 = scalarplus_class;
  ptVar1 = gensym("binops-tilde");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("-~");
  minus_class = class_new(ptVar1,minus_new,(t_method)0x0,0x38,0,A_GIMME,0);
  class_domainsignalin(minus_class,0x30);
  p_Var2 = minus_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,minus_dsp,ptVar1,A_CANT);
  p_Var2 = minus_class;
  ptVar1 = gensym("binops-tilde");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("-~");
  scalarminus_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x38,0,A_NULL);
  class_domainsignalin(scalarminus_class,0x30);
  p_Var2 = scalarminus_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,scalarminus_dsp,ptVar1,A_CANT);
  p_Var2 = scalarminus_class;
  ptVar1 = gensym("binops-tilde");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("*~");
  times_class = class_new(ptVar1,times_new,(t_method)0x0,0x38,0,A_GIMME,0);
  class_domainsignalin(times_class,0x30);
  p_Var2 = times_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,times_dsp,ptVar1,A_CANT);
  p_Var2 = times_class;
  ptVar1 = gensym("binops-tilde");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("*~");
  scalartimes_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x38,0,A_NULL);
  class_domainsignalin(scalartimes_class,0x30);
  p_Var2 = scalartimes_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,scalartimes_dsp,ptVar1,A_CANT);
  p_Var2 = scalartimes_class;
  ptVar1 = gensym("binops-tilde");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("/~");
  over_class = class_new(ptVar1,over_new,(t_method)0x0,0x38,0,A_GIMME,0);
  class_domainsignalin(over_class,0x30);
  p_Var2 = over_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,over_dsp,ptVar1,A_CANT);
  p_Var2 = over_class;
  ptVar1 = gensym("binops-tilde");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("/~");
  scalarover_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x38,0,A_NULL);
  class_domainsignalin(scalarover_class,0x30);
  p_Var2 = scalarover_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,scalarover_dsp,ptVar1,A_CANT);
  p_Var2 = scalarover_class;
  ptVar1 = gensym("binops-tilde");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("max~");
  max_class = class_new(ptVar1,max_new,(t_method)0x0,0x38,0,A_GIMME,0);
  class_domainsignalin(max_class,0x30);
  p_Var2 = max_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,max_dsp,ptVar1,A_CANT);
  p_Var2 = max_class;
  ptVar1 = gensym("binops-tilde");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("max~");
  scalarmax_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x38,0,A_NULL);
  class_domainsignalin(scalarmax_class,0x30);
  p_Var2 = scalarmax_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,scalarmax_dsp,ptVar1,A_CANT);
  p_Var2 = scalarmax_class;
  ptVar1 = gensym("binops-tilde");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("min~");
  min_class = class_new(ptVar1,min_new,(t_method)0x0,0x38,0,A_GIMME,0);
  class_domainsignalin(min_class,0x30);
  p_Var2 = min_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,min_dsp,ptVar1,A_CANT);
  p_Var2 = min_class;
  ptVar1 = gensym("binops-tilde");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("min~");
  scalarmin_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x38,0,A_NULL);
  class_domainsignalin(scalarmin_class,0x34);
  p_Var2 = scalarmin_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,scalarmin_dsp,ptVar1,A_CANT,0);
  p_Var2 = scalarmin_class;
  ptVar1 = gensym("binops-tilde");
  class_sethelpsymbol(p_Var2,ptVar1);
  return;
}

Assistant:

static void plus_setup(void)
{
    plus_class = class_new(gensym("+~"), (t_newmethod)plus_new, 0,
        sizeof(t_plus), 0, A_GIMME, 0);
    class_addmethod(plus_class, (t_method)plus_dsp, gensym("dsp"), A_CANT, 0);
    CLASS_MAINSIGNALIN(plus_class, t_plus, x_f);
    class_sethelpsymbol(plus_class, gensym("binops-tilde"));
    scalarplus_class = class_new(gensym("+~"), 0, 0,
        sizeof(t_scalarplus), 0, 0);
    CLASS_MAINSIGNALIN(scalarplus_class, t_scalarplus, x_f);
    class_addmethod(scalarplus_class, (t_method)scalarplus_dsp,
        gensym("dsp"), A_CANT, 0);
    class_sethelpsymbol(scalarplus_class, gensym("binops-tilde"));
}